

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_block_scalar(yaml_parser_t *parser,yaml_token_t *token,int literal)

{
  yaml_mark_t *pyVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  yaml_char_t *pyVar7;
  yaml_mark_t context_mark;
  yaml_mark_t context_mark_00;
  yaml_mark_t context_mark_01;
  yaml_mark_t start_mark_00;
  yaml_mark_t start_mark_01;
  int iVar8;
  yaml_scalar_style_t yVar9;
  yaml_char_t *pyVar10;
  bool bVar11;
  bool bVar12;
  int local_12c;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int trailing_blank;
  int leading_blank;
  int indent;
  int increment;
  int chomping;
  yaml_string_t trailing_breaks;
  yaml_string_t leading_break;
  yaml_string_t string;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  int literal_local;
  yaml_token_t *token_local;
  yaml_parser_t *parser_local;
  
  memset(&leading_break.pointer,0,0x18);
  memset(&trailing_breaks.pointer,0,0x18);
  memset(&increment,0,0x18);
  indent = 0;
  leading_blank = 0;
  trailing_blank = 0;
  bVar12 = false;
  leading_break.pointer = (yaml_char_t *)yaml_malloc(0x10);
  if (leading_break.pointer == (yaml_char_t *)0x0) {
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    string.start = leading_break.pointer + 0x10;
    string.end = leading_break.pointer;
    memset(leading_break.pointer,0,0x10);
    trailing_breaks.pointer = (yaml_char_t *)yaml_malloc(0x10);
    if (trailing_breaks.pointer == (yaml_char_t *)0x0) {
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
      leading_break.start = trailing_breaks.pointer + 0x10;
      leading_break.end = trailing_breaks.pointer;
      memset(trailing_breaks.pointer,0,0x10);
      _increment = (yaml_char_t *)yaml_malloc(0x10);
      if (_increment == (yaml_char_t *)0x0) {
        parser->error = YAML_MEMORY_ERROR;
      }
      else {
        trailing_breaks.start = _increment + 0x10;
        trailing_breaks.end = _increment;
        memset(_increment,0,0x10);
        pyVar1 = &parser->mark;
        sVar2 = pyVar1->index;
        sVar3 = (parser->mark).line;
        sVar4 = (parser->mark).column;
        start_mark_01 = *pyVar1;
        start_mark_00 = *pyVar1;
        context_mark_01 = *pyVar1;
        context_mark_00 = *pyVar1;
        context_mark = *pyVar1;
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = (parser->mark).column + 1;
        parser->unread = parser->unread - 1;
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          local_b8 = 1;
        }
        else {
          if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
            local_bc = 2;
          }
          else {
            if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
              local_c0 = 3;
            }
            else {
              local_c0 = 0;
              if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                local_c0 = 4;
              }
            }
            local_bc = local_c0;
          }
          local_b8 = local_bc;
        }
        (parser->buffer).pointer = (parser->buffer).pointer + local_b8;
        if ((parser->unread != 0) || (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 != 0)) {
          if ((*(parser->buffer).pointer == '+') || (*(parser->buffer).pointer == '-')) {
            indent = -1;
            if (*(parser->buffer).pointer == '+') {
              indent = 1;
            }
            (parser->mark).index = (parser->mark).index + 1;
            (parser->mark).column = (parser->mark).column + 1;
            parser->unread = parser->unread - 1;
            if ((*(parser->buffer).pointer & 0x80) == 0) {
              local_c4 = 1;
            }
            else {
              if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                local_c8 = 2;
              }
              else {
                if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                  local_cc = 3;
                }
                else {
                  local_cc = 0;
                  if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                    local_cc = 4;
                  }
                }
                local_c8 = local_cc;
              }
              local_c4 = local_c8;
            }
            (parser->buffer).pointer = (parser->buffer).pointer + local_c4;
            if ((parser->unread == 0) && (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 == 0))
            goto LAB_001b94e2;
            if ((0x2f < *(parser->buffer).pointer) && (*(parser->buffer).pointer < 0x3a)) {
              if (*(parser->buffer).pointer == '0') {
                yaml_parser_set_scanner_error
                          (parser,"while scanning a block scalar",context_mark,
                           "found an intendation indicator equal to 0");
                goto LAB_001b94e2;
              }
              leading_blank = *(parser->buffer).pointer - 0x30;
              (parser->mark).index = (parser->mark).index + 1;
              (parser->mark).column = (parser->mark).column + 1;
              parser->unread = parser->unread - 1;
              if ((*(parser->buffer).pointer & 0x80) == 0) {
                local_d0 = 1;
              }
              else {
                if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                  local_d4 = 2;
                }
                else {
                  if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                    local_d8 = 3;
                  }
                  else {
                    local_d8 = 0;
                    if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                      local_d8 = 4;
                    }
                  }
                  local_d4 = local_d8;
                }
                local_d0 = local_d4;
              }
              (parser->buffer).pointer = (parser->buffer).pointer + local_d0;
            }
          }
          else if ((0x2f < *(parser->buffer).pointer) && (*(parser->buffer).pointer < 0x3a)) {
            if (*(parser->buffer).pointer == '0') {
              yaml_parser_set_scanner_error
                        (parser,"while scanning a block scalar",context_mark_00,
                         "found an intendation indicator equal to 0");
              goto LAB_001b94e2;
            }
            leading_blank = *(parser->buffer).pointer - 0x30;
            (parser->mark).index = (parser->mark).index + 1;
            (parser->mark).column = (parser->mark).column + 1;
            parser->unread = parser->unread - 1;
            if ((*(parser->buffer).pointer & 0x80) == 0) {
              local_dc = 1;
            }
            else {
              if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                local_e0 = 2;
              }
              else {
                if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                  local_e4 = 3;
                }
                else {
                  local_e4 = 0;
                  if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                    local_e4 = 4;
                  }
                }
                local_e0 = local_e4;
              }
              local_dc = local_e0;
            }
            (parser->buffer).pointer = (parser->buffer).pointer + local_dc;
            if ((parser->unread == 0) && (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 == 0))
            goto LAB_001b94e2;
            if ((*(parser->buffer).pointer == '+') || (*(parser->buffer).pointer == '-')) {
              indent = -1;
              if (*(parser->buffer).pointer == '+') {
                indent = 1;
              }
              (parser->mark).index = (parser->mark).index + 1;
              (parser->mark).column = (parser->mark).column + 1;
              parser->unread = parser->unread - 1;
              if ((*(parser->buffer).pointer & 0x80) == 0) {
                local_e8 = 1;
              }
              else {
                if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                  local_ec = 2;
                }
                else {
                  if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                    local_f0 = 3;
                  }
                  else {
                    local_f0 = 0;
                    if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                      local_f0 = 4;
                    }
                  }
                  local_ec = local_f0;
                }
                local_e8 = local_ec;
              }
              (parser->buffer).pointer = (parser->buffer).pointer + local_e8;
            }
          }
          if (parser->unread != 0) goto LAB_001b7d9a;
          iVar8 = yaml_parser_update_buffer(parser,1);
          while (iVar8 != 0) {
LAB_001b7d9a:
            do {
              bVar11 = true;
              if (*(parser->buffer).pointer != ' ') {
                bVar11 = *(parser->buffer).pointer == '\t';
              }
              if (!bVar11) {
                if (*(parser->buffer).pointer == '#') goto LAB_001b7f42;
                goto LAB_001b81c4;
              }
              (parser->mark).index = (parser->mark).index + 1;
              (parser->mark).column = (parser->mark).column + 1;
              parser->unread = parser->unread - 1;
              if ((*(parser->buffer).pointer & 0x80) == 0) {
                local_f8 = 1;
              }
              else {
                if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                  local_fc = 2;
                }
                else {
                  if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                    local_100 = 3;
                  }
                  else {
                    local_100 = 0;
                    if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                      local_100 = 4;
                    }
                  }
                  local_fc = local_100;
                }
                local_f8 = local_fc;
              }
              (parser->buffer).pointer = (parser->buffer).pointer + local_f8;
            } while (parser->unread != 0);
            iVar8 = yaml_parser_update_buffer(parser,1);
          }
        }
      }
    }
  }
  goto LAB_001b94e2;
LAB_001b81c4:
  if (((((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) ||
       ((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85)))) ||
      ((((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
        ((parser->buffer).pointer[2] == 0xa8)) ||
       (((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
        ((parser->buffer).pointer[2] == 0xa9)))))) || (*(parser->buffer).pointer == '\0')) {
    if (((((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) ||
         ((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85)))) ||
        (((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
         ((parser->buffer).pointer[2] == 0xa8)))) ||
       (((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
        ((parser->buffer).pointer[2] == 0xa9)))) {
      if ((parser->unread < 2) && (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0))
      goto LAB_001b94e2;
      if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n')) {
        (parser->mark).index = (parser->mark).index + 2;
        (parser->mark).column = 0;
        (parser->mark).line = (parser->mark).line + 1;
        parser->unread = parser->unread - 2;
        (parser->buffer).pointer = (parser->buffer).pointer + 2;
      }
      else if ((((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) ||
               ((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85)))) ||
              ((((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
                ((parser->buffer).pointer[2] == 0xa8)) ||
               (((*(parser->buffer).pointer == 0xe2 && ((parser->buffer).pointer[1] == 0x80)) &&
                ((parser->buffer).pointer[2] == 0xa9)))))) {
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = 0;
        (parser->mark).line = (parser->mark).line + 1;
        parser->unread = parser->unread - 1;
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          local_114 = 1;
        }
        else {
          if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
            local_118 = 2;
          }
          else {
            if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
              local_11c = 3;
            }
            else {
              local_11c = 0;
              if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                local_11c = 4;
              }
            }
            local_118 = local_11c;
          }
          local_114 = local_118;
        }
        (parser->buffer).pointer = (parser->buffer).pointer + local_114;
      }
    }
    string.pointer = (yaml_char_t *)(parser->mark).index;
    sVar5 = (parser->mark).line;
    sVar6 = (parser->mark).column;
    if (leading_blank != 0) {
      if (parser->indent < 0) {
        local_12c = leading_blank;
      }
      else {
        local_12c = parser->indent + leading_blank;
      }
      trailing_blank = local_12c;
    }
    iVar8 = yaml_parser_scan_block_scalar_breaks
                      (parser,&trailing_blank,(yaml_string_t *)&increment,start_mark_00,
                       (yaml_mark_t *)&string.pointer);
    if ((iVar8 != 0) &&
       ((parser->unread != 0 || (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 != 0)))) {
      while( true ) {
        bVar11 = false;
        if ((int)(parser->mark).column == trailing_blank) {
          bVar11 = *(parser->buffer).pointer != '\0';
        }
        if (!bVar11) break;
        bVar11 = true;
        if (*(parser->buffer).pointer != ' ') {
          bVar11 = *(parser->buffer).pointer == '\t';
        }
        if ((((literal != 0) || (*trailing_breaks.pointer != '\n')) || (bVar12)) || (bVar11)) {
          iVar8 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                                   &trailing_breaks.pointer,&leading_break.end,&leading_break.start)
          ;
          if (iVar8 == 0) {
            parser->error = YAML_MEMORY_ERROR;
            goto LAB_001b94e2;
          }
          leading_break.end = trailing_breaks.pointer;
          memset(trailing_breaks.pointer,0,(long)leading_break.start - (long)trailing_breaks.pointer
                );
        }
        else {
          if (*_increment == '\0') {
            if ((string.start <= string.end + 5) &&
               (iVar8 = yaml_string_extend(&leading_break.pointer,&string.end,&string.start),
               iVar8 == 0)) {
              parser->error = YAML_MEMORY_ERROR;
              goto LAB_001b94e2;
            }
            *string.end = ' ';
            string.end = string.end + 1;
          }
          leading_break.end = trailing_breaks.pointer;
          memset(trailing_breaks.pointer,0,(long)leading_break.start - (long)trailing_breaks.pointer
                );
        }
        iVar8 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                                 (yaml_char_t **)&increment,&trailing_breaks.end,
                                 &trailing_breaks.start);
        if (iVar8 == 0) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_001b94e2;
        }
        trailing_breaks.end = _increment;
        memset(_increment,0,(long)trailing_breaks.start - (long)_increment);
        bVar12 = true;
        if (*(parser->buffer).pointer != ' ') {
          bVar12 = *(parser->buffer).pointer == '\t';
        }
        while( true ) {
          bVar11 = true;
          if (((*(parser->buffer).pointer != '\r') &&
              (bVar11 = true, *(parser->buffer).pointer != '\n')) &&
             ((((*(parser->buffer).pointer != 0xc2 ||
                (bVar11 = true, (parser->buffer).pointer[1] != 0x85)) &&
               (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
                (bVar11 = true, (parser->buffer).pointer[2] != 0xa8)))) &&
              (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
               (bVar11 = true, (parser->buffer).pointer[2] != 0xa9)))))) {
            bVar11 = *(parser->buffer).pointer == '\0';
          }
          if (bVar11) break;
          if ((string.start <= string.end + 5) &&
             (iVar8 = yaml_string_extend(&leading_break.pointer,&string.end,&string.start),
             iVar8 == 0)) {
            parser->error = YAML_MEMORY_ERROR;
            goto LAB_001b94e2;
          }
          if ((*(parser->buffer).pointer & 0x80) == 0) {
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            *string.end = *pyVar7;
            string.end = string.end + 1;
          }
          else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            pyVar10 = string.end + 1;
            *string.end = *pyVar7;
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            string.end = string.end + 2;
            *pyVar10 = *pyVar7;
          }
          else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            *string.end = *pyVar7;
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            pyVar10 = string.end + 2;
            string.end[1] = *pyVar7;
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            string.end = string.end + 3;
            *pyVar10 = *pyVar7;
          }
          else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            *string.end = *pyVar7;
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            string.end[1] = *pyVar7;
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            pyVar10 = string.end + 3;
            string.end[2] = *pyVar7;
            pyVar7 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar7 + 1;
            string.end = string.end + 4;
            *pyVar10 = *pyVar7;
          }
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = (parser->mark).column + 1;
          parser->unread = parser->unread - 1;
          if ((parser->unread == 0) && (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 == 0))
          goto LAB_001b94e2;
        }
        if ((parser->unread < 2) && (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0))
        goto LAB_001b94e2;
        if ((leading_break.start <= leading_break.end + 5) &&
           (iVar8 = yaml_string_extend(&trailing_breaks.pointer,&leading_break.end,
                                       &leading_break.start), iVar8 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_001b94e2;
        }
        if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n')) {
          *leading_break.end = '\n';
          (parser->buffer).pointer = (parser->buffer).pointer + 2;
          (parser->mark).index = (parser->mark).index + 2;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 2;
          leading_break.end = leading_break.end + 1;
        }
        else if ((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) {
          *leading_break.end = '\n';
          (parser->buffer).pointer = (parser->buffer).pointer + 1;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 1;
          leading_break.end = leading_break.end + 1;
        }
        else if ((*(parser->buffer).pointer == 0xc2) && ((parser->buffer).pointer[1] == 0x85)) {
          *leading_break.end = '\n';
          (parser->buffer).pointer = (parser->buffer).pointer + 2;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 1;
          leading_break.end = leading_break.end + 1;
        }
        else if (((*(parser->buffer).pointer == 0xe2) && ((parser->buffer).pointer[1] == 0x80)) &&
                (((parser->buffer).pointer[2] == 0xa8 || ((parser->buffer).pointer[2] == 0xa9)))) {
          pyVar7 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar7 + 1;
          *leading_break.end = *pyVar7;
          pyVar7 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar7 + 1;
          pyVar10 = leading_break.end + 2;
          leading_break.end[1] = *pyVar7;
          pyVar7 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar7 + 1;
          leading_break.end = leading_break.end + 3;
          *pyVar10 = *pyVar7;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 1;
        }
        iVar8 = yaml_parser_scan_block_scalar_breaks
                          (parser,&trailing_blank,(yaml_string_t *)&increment,start_mark_01,
                           (yaml_mark_t *)&string.pointer);
        if (iVar8 == 0) goto LAB_001b94e2;
      }
      if (indent != -1) {
        iVar8 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                                 &trailing_breaks.pointer,&leading_break.end,&leading_break.start);
        if (iVar8 == 0) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_001b94e2;
        }
        leading_break.end = trailing_breaks.pointer;
      }
      if (indent == 1) {
        iVar8 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                                 (yaml_char_t **)&increment,&trailing_breaks.end,
                                 &trailing_breaks.start);
        if (iVar8 == 0) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_001b94e2;
        }
        trailing_breaks.end = _increment;
      }
      memset(token,0,0x50);
      token->type = YAML_SCALAR_TOKEN;
      (token->start_mark).index = sVar2;
      (token->start_mark).line = sVar3;
      (token->start_mark).column = sVar4;
      (token->end_mark).index = (size_t)string.pointer;
      (token->end_mark).line = sVar5;
      (token->end_mark).column = sVar6;
      (token->data).tag.handle = leading_break.pointer;
      (token->data).tag.suffix = string.end + -(long)leading_break.pointer;
      yVar9 = YAML_FOLDED_SCALAR_STYLE;
      if (literal != 0) {
        yVar9 = YAML_LITERAL_SCALAR_STYLE;
      }
      (token->data).scalar.style = yVar9;
      yaml_free(trailing_breaks.pointer);
      leading_break.start = (yaml_char_t *)0x0;
      leading_break.end = (yaml_char_t *)0x0;
      trailing_breaks.pointer = (yaml_char_t *)0x0;
      yaml_free(_increment);
      return 1;
    }
  }
  else {
    yaml_parser_set_scanner_error
              (parser,"while scanning a block scalar",context_mark_01,
               "did not find expected comment or line break");
  }
  goto LAB_001b94e2;
  while( true ) {
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = (parser->mark).column + 1;
    parser->unread = parser->unread - 1;
    if ((*(parser->buffer).pointer & 0x80) == 0) {
      local_108 = 1;
    }
    else {
      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        local_10c = 2;
      }
      else {
        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          local_110 = 3;
        }
        else {
          local_110 = 0;
          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            local_110 = 4;
          }
        }
        local_10c = local_110;
      }
      local_108 = local_10c;
    }
    (parser->buffer).pointer = (parser->buffer).pointer + local_108;
    if ((parser->unread == 0) && (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 == 0)) break;
LAB_001b7f42:
    bVar11 = true;
    if ((((*(parser->buffer).pointer != '\r') && (bVar11 = true, *(parser->buffer).pointer != '\n'))
        && ((*(parser->buffer).pointer != 0xc2 ||
            (bVar11 = true, (parser->buffer).pointer[1] != 0x85)))) &&
       ((((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
         (bVar11 = true, (parser->buffer).pointer[2] != 0xa8)) &&
        (((*(parser->buffer).pointer != 0xe2 || ((parser->buffer).pointer[1] != 0x80)) ||
         (bVar11 = true, (parser->buffer).pointer[2] != 0xa9)))))) {
      bVar11 = *(parser->buffer).pointer == '\0';
    }
    if (bVar11) goto LAB_001b81c4;
  }
LAB_001b94e2:
  yaml_free(leading_break.pointer);
  string.start = (yaml_char_t *)0x0;
  string.end = (yaml_char_t *)0x0;
  leading_break.pointer = (yaml_char_t *)0x0;
  yaml_free(trailing_breaks.pointer);
  leading_break.start = (yaml_char_t *)0x0;
  leading_break.end = (yaml_char_t *)0x0;
  trailing_breaks.pointer = (yaml_char_t *)0x0;
  yaml_free(_increment);
  return 0;
}

Assistant:

static int
yaml_parser_scan_block_scalar(yaml_parser_t *parser, yaml_token_t *token,
        int literal)
{
    yaml_mark_t start_mark;
    yaml_mark_t end_mark;
    yaml_string_t string = NULL_STRING;
    yaml_string_t leading_break = NULL_STRING;
    yaml_string_t trailing_breaks = NULL_STRING;
    int chomping = 0;
    int increment = 0;
    int indent = 0;
    int leading_blank = 0;
    int trailing_blank = 0;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;
    if (!STRING_INIT(parser, leading_break, INITIAL_STRING_SIZE)) goto error;
    if (!STRING_INIT(parser, trailing_breaks, INITIAL_STRING_SIZE)) goto error;

    /* Eat the indicator '|' or '>'. */

    start_mark = parser->mark;

    SKIP(parser);

    /* Scan the additional block scalar indicators. */

    if (!CACHE(parser, 1)) goto error;

    /* Check for a chomping indicator. */

    if (CHECK(parser->buffer, '+') || CHECK(parser->buffer, '-'))
    {
        /* Set the chomping method and eat the indicator. */

        chomping = CHECK(parser->buffer, '+') ? +1 : -1;

        SKIP(parser);

        /* Check for an indentation indicator. */

        if (!CACHE(parser, 1)) goto error;

        if (IS_DIGIT(parser->buffer))
        {
            /* Check that the intendation is greater than 0. */

            if (CHECK(parser->buffer, '0')) {
                yaml_parser_set_scanner_error(parser, "while scanning a block scalar",
                        start_mark, "found an intendation indicator equal to 0");
                goto error;
            }

            /* Get the intendation level and eat the indicator. */

            increment = AS_DIGIT(parser->buffer);

            SKIP(parser);
        }
    }

    /* Do the same as above, but in the opposite order. */

    else if (IS_DIGIT(parser->buffer))
    {
        if (CHECK(parser->buffer, '0')) {
            yaml_parser_set_scanner_error(parser, "while scanning a block scalar",
                    start_mark, "found an intendation indicator equal to 0");
            goto error;
        }

        increment = AS_DIGIT(parser->buffer);

        SKIP(parser);

        if (!CACHE(parser, 1)) goto error;

        if (CHECK(parser->buffer, '+') || CHECK(parser->buffer, '-')) {
            chomping = CHECK(parser->buffer, '+') ? +1 : -1;

            SKIP(parser);
        }
    }

    /* Eat whitespaces and comments to the end of the line. */

    if (!CACHE(parser, 1)) goto error;

    while (IS_BLANK(parser->buffer)) {
        SKIP(parser);
        if (!CACHE(parser, 1)) goto error;
    }

    if (CHECK(parser->buffer, '#')) {
        while (!IS_BREAKZ(parser->buffer)) {
            SKIP(parser);
            if (!CACHE(parser, 1)) goto error;
        }
    }

    /* Check if we are at the end of the line. */

    if (!IS_BREAKZ(parser->buffer)) {
        yaml_parser_set_scanner_error(parser, "while scanning a block scalar",
                start_mark, "did not find expected comment or line break");
        goto error;
    }

    /* Eat a line break. */

    if (IS_BREAK(parser->buffer)) {
        if (!CACHE(parser, 2)) goto error;
        SKIP_LINE(parser);
    }

    end_mark = parser->mark;

    /* Set the intendation level if it was specified. */

    if (increment) {
        indent = parser->indent >= 0 ? parser->indent+increment : increment;
    }

    /* Scan the leading line breaks and determine the indentation level if needed. */

    if (!yaml_parser_scan_block_scalar_breaks(parser, &indent, &trailing_breaks,
                start_mark, &end_mark)) goto error;

    /* Scan the block scalar content. */

    if (!CACHE(parser, 1)) goto error;

    while ((int)parser->mark.column == indent && !IS_Z(parser->buffer))
    {
        /*
         * We are at the beginning of a non-empty line.
         */

        /* Is it a trailing whitespace? */

        trailing_blank = IS_BLANK(parser->buffer);

        /* Check if we need to fold the leading line break. */

        if (!literal && (*leading_break.start == '\n')
                && !leading_blank && !trailing_blank)
        {
            /* Do we need to join the lines by space? */

            if (*trailing_breaks.start == '\0') {
                if (!STRING_EXTEND(parser, string)) goto error;
                *(string.pointer ++) = ' ';
            }

            CLEAR(parser, leading_break);
        }
        else {
            if (!JOIN(parser, string, leading_break)) goto error;
            CLEAR(parser, leading_break);
        }

        /* Append the remaining line breaks. */

        if (!JOIN(parser, string, trailing_breaks)) goto error;
        CLEAR(parser, trailing_breaks);

        /* Is it a leading whitespace? */

        leading_blank = IS_BLANK(parser->buffer);

        /* Consume the current line. */

        while (!IS_BREAKZ(parser->buffer)) {
            if (!READ(parser, string)) goto error;
            if (!CACHE(parser, 1)) goto error;
        }

        /* Consume the line break. */

        if (!CACHE(parser, 2)) goto error;

        if (!READ_LINE(parser, leading_break)) goto error;

        /* Eat the following intendation spaces and line breaks. */

        if (!yaml_parser_scan_block_scalar_breaks(parser,
                    &indent, &trailing_breaks, start_mark, &end_mark)) goto error;
    }

    /* Chomp the tail. */

    if (chomping != -1) {
        if (!JOIN(parser, string, leading_break)) goto error;
    }
    if (chomping == 1) {
        if (!JOIN(parser, string, trailing_breaks)) goto error;
    }

    /* Create a token. */

    SCALAR_TOKEN_INIT(*token, string.start, string.pointer-string.start,
            literal ? YAML_LITERAL_SCALAR_STYLE : YAML_FOLDED_SCALAR_STYLE,
            start_mark, end_mark);

    STRING_DEL(parser, leading_break);
    STRING_DEL(parser, trailing_breaks);

    return 1;

error:
    STRING_DEL(parser, string);
    STRING_DEL(parser, leading_break);
    STRING_DEL(parser, trailing_breaks);

    return 0;
}